

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_zip_empty.c
# Opt level: O0

void test_write_format_zip_empty(void)

{
  archive *paVar1;
  archive *paVar2;
  size_t used;
  char buff [256];
  archive_entry *ae;
  archive *a;
  void *in_stack_fffffffffffffec8;
  size_t *in_stack_fffffffffffffed0;
  archive *a_00;
  archive *in_stack_fffffffffffffed8;
  void *buff_00;
  undefined4 in_stack_fffffffffffffee0;
  wchar_t in_stack_fffffffffffffee4;
  archive *in_stack_fffffffffffffee8;
  void *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff10;
  void *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  void *in_stack_ffffffffffffff28;
  wchar_t in_stack_ffffffffffffff34;
  char *in_stack_ffffffffffffff38;
  size_t in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  void *in_stack_ffffffffffffff60;
  
  paVar1 = archive_write_new();
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                   (wchar_t)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                   (wchar_t)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
                   in_stack_fffffffffffffec8);
  archive_write_set_format_zip(in_stack_fffffffffffffed8);
  assertion_equal_int((char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                      (longlong)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
                      (longlong)paVar1,(char *)0x21aadc,in_stack_ffffffffffffff00);
  archive_write_add_filter_none(paVar1);
  assertion_equal_int((char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                      (longlong)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
                      (longlong)paVar1,(char *)0x21ab1b,in_stack_ffffffffffffff00);
  archive_write_set_bytes_per_block
            (in_stack_fffffffffffffed8,(int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
  assertion_equal_int((char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                      (longlong)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
                      (longlong)paVar1,(char *)0x21ab5f,in_stack_ffffffffffffff00);
  archive_write_set_bytes_in_last_block
            (in_stack_fffffffffffffed8,(int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
  assertion_equal_int((char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                      (longlong)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
                      (longlong)paVar1,(char *)0x21aba3,in_stack_ffffffffffffff00);
  archive_write_open_memory
            (in_stack_fffffffffffffee8,
             (void *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             (size_t)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  assertion_equal_int((char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                      (longlong)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
                      (longlong)paVar1,(char *)0x21abf1,in_stack_ffffffffffffff00);
  archive_write_close((archive *)0x21abfe);
  assertion_equal_int((char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                      (longlong)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
                      (longlong)paVar1,(char *)0x21ac30,in_stack_ffffffffffffff00);
  archive_write_free((archive *)0x21ac3d);
  assertion_equal_int((char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                      (longlong)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,0,
                      (char *)0x21ac6b,in_stack_ffffffffffffff00);
  assertion_equal_int((char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                      (longlong)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,0,
                      (char *)0x21ac9f,in_stack_ffffffffffffff00);
  paVar1 = (archive *)0x16;
  a_00 = (archive *)0x2e609c;
  buff_00 = (void *)0x0;
  assertion_equal_mem(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,in_stack_ffffffffffffff28,
                      in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                      in_stack_ffffffffffffff50,in_stack_ffffffffffffff58,in_stack_ffffffffffffff60)
  ;
  paVar2 = archive_read_new();
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                   (wchar_t)((ulong)buff_00 >> 0x20),(wchar_t)buff_00,(char *)a_00,paVar1);
  archive_read_support_format_zip(paVar1);
  paVar1 = paVar2;
  assertion_equal_int((char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,(longlong)buff_00,
                      (char *)a_00,(longlong)paVar2,(char *)0x21ad5f,in_stack_ffffffffffffff00);
  archive_read_open_memory(a_00,paVar1,0x21ad76);
  paVar1 = paVar2;
  assertion_equal_int((char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,(longlong)buff_00,
                      (char *)a_00,(longlong)paVar2,(char *)0x21ada8,in_stack_ffffffffffffff00);
  archive_read_next_header(a_00,(archive_entry **)paVar1);
  assertion_equal_int((char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,(longlong)buff_00,
                      (char *)a_00,(longlong)paVar2,(char *)0x21adf0,in_stack_ffffffffffffff00);
  archive_write_free((archive *)0x21adfd);
  paVar1 = (archive *)0x0;
  assertion_equal_int((char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,(longlong)buff_00,
                      (char *)a_00,0,(char *)0x21ae2b,in_stack_ffffffffffffff00);
  paVar2 = archive_read_new();
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                   (wchar_t)((ulong)buff_00 >> 0x20),(wchar_t)buff_00,(char *)a_00,paVar1);
  archive_read_support_format_zip(paVar1);
  paVar1 = paVar2;
  assertion_equal_int((char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,(longlong)buff_00,
                      (char *)a_00,(longlong)paVar2,(char *)0x21aea0,in_stack_ffffffffffffff00);
  read_open_memory((archive *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),buff_00,
                   (size_t)a_00,(size_t)paVar1);
  paVar1 = paVar2;
  assertion_equal_int((char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,(longlong)buff_00,
                      (char *)a_00,(longlong)paVar2,(char *)0x21aeee,in_stack_ffffffffffffff00);
  archive_read_next_header(a_00,(archive_entry **)paVar1);
  assertion_equal_int((char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,(longlong)buff_00,
                      (char *)a_00,(longlong)paVar2,(char *)0x21af36,in_stack_ffffffffffffff00);
  archive_write_free((archive *)0x21af43);
  paVar1 = (archive *)0x0;
  assertion_equal_int((char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,(longlong)buff_00,
                      (char *)a_00,0,(char *)0x21af71,in_stack_ffffffffffffff00);
  paVar2 = archive_read_new();
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                   (wchar_t)((ulong)buff_00 >> 0x20),(wchar_t)buff_00,(char *)a_00,paVar1);
  archive_read_support_format_zip(paVar1);
  paVar1 = paVar2;
  assertion_equal_int((char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,(longlong)buff_00,
                      (char *)a_00,(longlong)paVar2,(char *)0x21afe6,in_stack_ffffffffffffff00);
  read_open_memory_seek
            ((archive *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),buff_00,
             (size_t)a_00,(size_t)paVar1);
  paVar1 = paVar2;
  assertion_equal_int((char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,(longlong)buff_00,
                      (char *)a_00,(longlong)paVar2,(char *)0x21b032,in_stack_ffffffffffffff00);
  archive_read_next_header(a_00,(archive_entry **)paVar1);
  assertion_equal_int((char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,(longlong)buff_00,
                      (char *)a_00,(longlong)paVar2,(char *)0x21b07a,in_stack_ffffffffffffff00);
  archive_write_free((archive *)0x21b087);
  assertion_equal_int((char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,(longlong)buff_00,
                      (char *)a_00,0,(char *)0x21b0b5,in_stack_ffffffffffffff00);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_zip_empty)
{
	struct archive *a;
	struct archive_entry *ae;
	char buff[256];
	size_t used;

	/* Zip format: Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_zip(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_bytes_per_block(a, 1));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_bytes_in_last_block(a, 1));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, sizeof(buff), &used));

	/* Close out the archive without writing anything. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Verify the correct format for an empy Zip archive. */
	assertEqualInt(used, 22);
	assertEqualMem(buff,
	    "PK\005\006\0\0\0\0\0\0\0\0\0\0\0\0\0\0\0\0\0\0",
	    22);

	/* Verify that we read this kind of empty archive correctly. */
	/* Try with the standard memory reader, and with the test
	   memory reader with and without seek support. */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_zip(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff, 22));
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_zip(a));
	assertEqualIntA(a, ARCHIVE_OK, read_open_memory(a, buff, 22, 1));
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_zip(a));
	assertEqualIntA(a, ARCHIVE_OK, read_open_memory_seek(a, buff, 22, 22));
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));
}